

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O2

void __thiscall Environment::Environment(Environment *this,Environment *other)

{
  __shared_ptr<Member,(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2> *this_01;
  __node_base *p_Var1;
  ptr<Function> function;
  ptr<Member> member;
  shared_ptr<Member> local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (this->symbols)._M_h._M_buckets = &(this->symbols)._M_h._M_single_bucket;
  (this->symbols)._M_h._M_bucket_count = 1;
  (this->symbols)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->symbols)._M_h._M_element_count = 0;
  (this->symbols)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->symbols)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->symbols)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(other->symbols)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::__shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2> *)(p_Var1 + 7));
    std::dynamic_pointer_cast<Function,Member>(&local_60);
    if (local_60.super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      this_01 = &std::__detail::
                 _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,(key_type *)(p_Var1 + 1))->
                 super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>::operator=(this_01,&local_40);
    }
    else {
      std::make_shared<Function,Function&>((Function *)&stack0xffffffffffffffb0);
      this_00 = (__shared_ptr<Member,(__gnu_cxx::_Lock_policy)2> *)
                std::__detail::
                _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this,(key_type *)(p_Var1 + 1));
      std::__shared_ptr<Member,(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,(__shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2> *)
                         &stack0xffffffffffffffb0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  return;
}

Assistant:

Environment::Environment(const Environment &other) {
    for(const auto& it : other.symbols) {
        ptr<Member> member = it.second;
        ptr<Function> function = std::dynamic_pointer_cast<Function>(member);
        if(function) {
            symbols[it.first] = make<Function>(*function);
        } else {
            symbols[it.first] = member;
        }
    }
}